

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

void __thiscall Vgm_Emu::set_tempo_(Vgm_Emu *this,double t)

{
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  
  if (*(long *)(in_RDI + 0xee0) != 0) {
    *(long *)(in_RDI + 0xee8) = (long)(in_XMM0_Qa * 44100.0 + 0.5);
    dVar1 = ::floor((4096.0 / (double)*(long *)(in_RDI + 0xee8)) * (double)*(long *)(in_RDI + 0xee0)
                    + 0.5);
    *(int *)(in_RDI + 0x544) = (int)(long)dVar1;
    dVar1 = ::floor((*(double *)(in_RDI + 0xed8) * 4096.0) / (double)*(long *)(in_RDI + 0xee8) + 0.5
                   );
    *(int *)(in_RDI + 0x540) = (int)(long)dVar1 + 2;
  }
  return;
}

Assistant:

void Vgm_Emu::set_tempo_( double t )
{
	if ( psg_rate )
	{
		vgm_rate = (long) (44100 * t + 0.5);
		blip_time_factor = (long) floor( double (1L << blip_time_bits) / vgm_rate * psg_rate + 0.5 );
		//debug_printf( "blip_time_factor: %ld\n", blip_time_factor );
		//debug_printf( "vgm_rate: %ld\n", vgm_rate );
		// TODO: remove? calculates vgm_rate more accurately (above differs at most by one Hz only)
		//blip_time_factor = (long) floor( double (1L << blip_time_bits) * psg_rate / 44100 / t + 0.5 );
		//vgm_rate = (long) floor( double (1L << blip_time_bits) * psg_rate / blip_time_factor + 0.5 );
		
		fm_time_factor = 2 + (long) floor( fm_rate * (1L << fm_time_bits) / vgm_rate + 0.5 );
	}
}